

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O0

FilePath * de::FilePath::normalize(FilePath *__return_storage_ptr__,FilePath *path)

{
  FilePath *pFVar1;
  FilePath local_38;
  FilePath *local_18;
  FilePath *path_local;
  
  local_18 = path;
  path_local = __return_storage_ptr__;
  FilePath(&local_38,path);
  pFVar1 = normalize(&local_38);
  FilePath(__return_storage_ptr__,pFVar1);
  ~FilePath(&local_38);
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::normalize (const FilePath& path)
{
	return FilePath(path).normalize();
}